

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::Block::performLocalNameSearch
          (Block *this,NameSearch *search,Statement *statementToSearchUpTo)

{
  size_t sVar1;
  pointer ppVar2;
  string *psVar3;
  Statement *pSVar4;
  ASTObject *pAVar5;
  pool_ref<soul::AST::Statement> *s;
  pointer ppVar6;
  ASTObject *o;
  
  if (search->findVariables == true) {
    sVar1 = (search->partiallyQualifiedPath).pathSections.numActive;
    if (sVar1 == 0) {
      throwInternalCompilerError("! empty()","back",0xaa);
    }
    ppVar6 = (this->statements).
             super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->statements).
             super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar6 != ppVar2) {
      psVar3 = (search->partiallyQualifiedPath).pathSections.items[sVar1 - 1].name;
      o = (ASTObject *)0x0;
      do {
        pSVar4 = ppVar6->object;
        if (pSVar4 == statementToSearchUpTo) break;
        if (pSVar4 != (Statement *)0x0) {
          pAVar5 = (ASTObject *)
                   __dynamic_cast(pSVar4,&Statement::typeinfo,&VariableDeclaration::typeinfo,0);
          if ((pAVar5 != (ASTObject *)0x0) && ((string *)pAVar5[1]._vptr_ASTObject == psVar3)) {
            o = pAVar5;
          }
        }
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar2);
      if (o != (ASTObject *)0x0) {
        Scope::NameSearch::addResult(search,o);
        return;
      }
    }
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* statementToSearchUpTo) const override
        {
            if (search.findVariables)
            {
                auto name = search.partiallyQualifiedPath.getLastPart();
                pool_ptr<VariableDeclaration> lastMatch;

                for (auto& s : statements)
                {
                    if (s.getPointer() == statementToSearchUpTo)
                        break;

                    if (auto v = cast<VariableDeclaration> (s))
                        if (v->name == name)
                            lastMatch = v;
                }

                if (lastMatch != nullptr)
                    search.addResult (*lastMatch);
            }
        }